

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseF32(WastParser *this,Const *const_,ConstType const_type)

{
  bool bVar1;
  Result result_00;
  Literal *pLVar2;
  uint32_t *in_R8;
  string_view v;
  uint32_t local_8c;
  ulong uStack_88;
  uint32_t f32_bits;
  Literal literal;
  Token token;
  ExpectedNan local_28;
  ConstType local_24;
  ExpectedNan expected;
  ConstType const_type_local;
  Const *const__local;
  WastParser *this_local;
  Result result;
  
  local_24 = const_type;
  _expected = const_;
  const__local = (Const *)this;
  if (const_type == Expectation) {
    result_00 = ParseExpectedNan(this,&local_28);
    bVar1 = Succeeded(result_00);
    if (bVar1) {
      Const::set_f32(_expected,local_28);
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
  }
  Consume((Token *)&literal.text._M_str,this);
  bVar1 = Token::HasLiteral((Token *)&literal.text._M_str);
  if (bVar1) {
    pLVar2 = Token::literal((Token *)&literal.text._M_str);
    uStack_88 = *(ulong *)pLVar2;
    literal._0_8_ = (pLVar2->text)._M_len;
    literal.text._M_len = (size_t)(pLVar2->text)._M_str;
    v._M_str = (char *)&local_8c;
    v._M_len = literal.text._M_len;
    this_local._4_4_ =
         ParseFloat((wabt *)(uStack_88 & 0xffffffff),(LiteralType)literal._0_8_,v,in_R8);
    Const::set_f32(_expected,local_8c);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseF32(Const* const_, ConstType const_type) {
  ExpectedNan expected;
  if (const_type == ConstType::Expectation &&
      Succeeded(ParseExpectedNan(&expected))) {
    const_->set_f32(expected);
    return Result::Ok;
  }

  auto token = Consume();
  if (!token.HasLiteral()) {
    return Result::Error;
  }

  auto literal = token.literal();
  uint32_t f32_bits;
  Result result = ParseFloat(literal.type, literal.text, &f32_bits);
  const_->set_f32(f32_bits);
  return result;
}